

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O3

FT_Error FT_Raccess_Get_HeaderInfo
                   (FT_Library library,FT_Stream stream,FT_Long rfork_offset,FT_Long *map_offset,
                   FT_Long *rdata_pos)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [14];
  undefined1 auVar5 [12];
  unkbyte10 Var6;
  FT_UInt16 FVar7;
  FT_Error FVar8;
  int iVar9;
  undefined4 uVar10;
  unsigned_long uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  char cVar22;
  char cVar23;
  char cVar24;
  undefined1 auVar21 [16];
  char cVar25;
  char cVar41;
  char cVar42;
  char cVar43;
  undefined1 auVar29 [16];
  undefined1 auVar37 [16];
  uchar head [16];
  uchar head2 [16];
  byte local_58 [4];
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  byte local_50;
  byte local_4f;
  byte local_4e;
  byte local_4d;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  byte local_49;
  int local_3c;
  FT_Byte local_38 [15];
  char local_29;
  undefined1 auVar30 [16];
  undefined1 auVar38 [16];
  undefined1 auVar31 [16];
  undefined1 auVar26 [11];
  undefined1 auVar32 [16];
  undefined1 auVar39 [16];
  undefined1 auVar27 [12];
  undefined1 auVar33 [16];
  undefined1 auVar28 [13];
  undefined1 auVar34 [16];
  undefined1 auVar40 [16];
  undefined1 auVar36 [16];
  undefined1 auVar35 [16];
  undefined2 uVar44;
  
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (stream->size < (ulong)rfork_offset) {
      return 0x55;
    }
  }
  else {
    uVar11 = (*stream->read)(stream,rfork_offset,(uchar *)0x0,0);
    if (uVar11 != 0) {
      return 0x55;
    }
  }
  stream->pos = rfork_offset;
  FVar8 = FT_Stream_Read(stream,local_58,0x10);
  if (FVar8 != 0) {
    return FVar8;
  }
  if ((char)(local_58[0] | local_54 | local_50 | local_4c) < '\0') {
    return 2;
  }
  uVar12 = (ulong)local_58[3] |
           (ulong)((uint)local_58[2] << 8 | (uint)local_58[1] << 0x10 | (uint)local_58[0] << 0x18);
  *rdata_pos = uVar12;
  uVar16 = (uint)local_51 | (uint)local_52 << 8 | (uint)local_53 << 0x10 | (uint)local_54 << 0x18;
  uVar17 = (ulong)uVar16;
  if (uVar16 == 0) {
    return 2;
  }
  uVar14 = (ulong)local_4d |
           (ulong)((uint)local_4e << 8 | (uint)local_4f << 0x10 | (uint)local_50 << 0x18);
  uVar15 = (ulong)((uint)local_4a << 8 | (uint)local_4b << 0x10 | (uint)local_4c << 0x18) |
           (ulong)local_49;
  if ((uint)uVar12 < uVar16) {
    if ((long)(uVar17 - uVar14) < (long)uVar12) {
      return 2;
    }
  }
  else if ((long)(uVar12 - uVar15) < (long)uVar17) {
    return 2;
  }
  if ((long)(uVar14 + uVar12 ^ 0x7fffffffffffffff) < rfork_offset) {
    return 2;
  }
  if ((long)(uVar15 + uVar17 ^ 0x7fffffffffffffff) < rfork_offset) {
    return 2;
  }
  if (stream->size < uVar14 + uVar12 + rfork_offset) {
    return 2;
  }
  uVar17 = uVar17 + rfork_offset;
  if (stream->size < uVar15 + uVar17) {
    return 2;
  }
  *rdata_pos = uVar12 + rfork_offset;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (stream->size < uVar17) {
      return 0x55;
    }
  }
  else {
    uVar11 = (*stream->read)(stream,uVar17,(uchar *)0x0,0);
    if (uVar11 != 0) {
      return 0x55;
    }
  }
  stream->pos = uVar17;
  local_29 = local_49 + 1;
  FVar8 = FT_Stream_Read(stream,local_38,0x10);
  if (FVar8 != 0) {
    return FVar8;
  }
  lVar13 = 0;
  auVar18 = (undefined1  [16])0x0;
  auVar19 = (undefined1  [16])0x0;
  do {
    uVar10 = *(undefined4 *)(local_38 + lVar13);
    uVar1 = *(undefined4 *)(local_58 + lVar13);
    cVar25 = -((char)uVar1 == (char)uVar10);
    cVar22 = (char)((uint)uVar10 >> 8);
    cVar41 = -((char)((uint)uVar1 >> 8) == cVar22);
    cVar23 = (char)((uint)uVar10 >> 0x10);
    cVar42 = -((char)((uint)uVar1 >> 0x10) == cVar23);
    cVar24 = (char)((uint)uVar10 >> 0x18);
    cVar43 = -((char)((uint)uVar1 >> 0x18) == cVar24);
    auVar31._0_9_ = CONCAT18(0xff,0xff00000000000000);
    auVar26._0_10_ = CONCAT19(0xff,auVar31._0_9_);
    auVar26[10] = 0xff;
    auVar27[0xb] = 0xff;
    auVar27._0_11_ = auVar26;
    auVar28[0xc] = 0xff;
    auVar28._0_12_ = auVar27;
    auVar36[0xd] = 0xff;
    auVar36._0_13_ = auVar28;
    auVar21[0] = -((char)uVar10 == '\0');
    auVar21._1_3_ = 0;
    auVar21[4] = -(cVar22 == '\0');
    auVar21._5_2_ = 0;
    auVar21[7] = -(cVar22 == '\0');
    auVar21[8] = -(cVar23 == '\0');
    auVar21[9] = -(cVar23 == '\0');
    auVar21[10] = -(cVar23 == '\0');
    auVar21[0xb] = -(cVar23 == '\0');
    auVar21[0xc] = -(cVar24 == '\0');
    auVar21[0xd] = -(cVar24 == '\0');
    auVar21[0xe] = -(cVar24 == '\0');
    auVar21[0xf] = -(cVar24 == '\0');
    auVar2._8_4_ = 0xffffffff;
    auVar2._0_8_ = 0xffffffffffffffff;
    auVar2._12_4_ = 0xffffffff;
    auVar19 = auVar19 | auVar21 ^ auVar2;
    auVar36[0xe] = 0xff;
    auVar36[0xf] = 0xff;
    auVar35._14_2_ = auVar36._14_2_;
    auVar35[0xd] = 0xff;
    auVar35._0_13_ = auVar28;
    auVar34._13_3_ = auVar35._13_3_;
    auVar34[0xc] = 0xff;
    auVar34._0_12_ = auVar27;
    auVar33._12_4_ = auVar34._12_4_;
    auVar33[0xb] = 0xff;
    auVar33._0_11_ = auVar26;
    auVar32._11_5_ = auVar33._11_5_;
    auVar32[10] = 0xff;
    auVar32._0_10_ = auVar26._0_10_;
    auVar31._10_6_ = auVar32._10_6_;
    auVar31[9] = 0xff;
    auVar30._9_7_ = auVar31._9_7_;
    auVar30[8] = 0xff;
    auVar30._0_8_ = 0xff00000000000000;
    Var6 = CONCAT91(CONCAT81(auVar30._8_8_,cVar43),cVar43);
    auVar5._2_10_ = Var6;
    auVar5[1] = cVar42;
    auVar5[0] = cVar42;
    auVar4._2_12_ = auVar5;
    auVar4[1] = cVar41;
    auVar4[0] = cVar41;
    auVar29._0_2_ = CONCAT11(cVar25,cVar25);
    auVar29._2_14_ = auVar4;
    uVar44 = (undefined2)Var6;
    auVar40._0_12_ = auVar29._0_12_;
    auVar40._12_2_ = uVar44;
    auVar40._14_2_ = uVar44;
    auVar39._12_4_ = auVar40._12_4_;
    auVar39._0_10_ = auVar29._0_10_;
    auVar39._10_2_ = auVar5._0_2_;
    auVar38._10_6_ = auVar39._10_6_;
    auVar38._0_8_ = auVar29._0_8_;
    auVar38._8_2_ = auVar5._0_2_;
    auVar37._8_8_ = auVar38._8_8_;
    auVar37._6_2_ = auVar4._0_2_;
    auVar37._4_2_ = auVar4._0_2_;
    auVar37._2_2_ = auVar29._0_2_;
    auVar37._0_2_ = auVar29._0_2_;
    auVar3._8_4_ = 0xffffffff;
    auVar3._0_8_ = 0xffffffffffffffff;
    auVar3._12_4_ = 0xffffffff;
    auVar18 = auVar18 | auVar37 ^ auVar3;
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0x10);
  auVar20._0_4_ = auVar19._0_4_ << 0x1f;
  auVar20._4_4_ = auVar19._4_4_ << 0x1f;
  auVar20._8_4_ = auVar19._8_4_ << 0x1f;
  auVar20._12_4_ = auVar19._12_4_ << 0x1f;
  iVar9 = movmskps(0x10,auVar20);
  if ((iVar9 != 0) &&
     (auVar19._0_4_ = auVar18._0_4_ << 0x1f, auVar19._4_4_ = auVar18._4_4_ << 0x1f,
     auVar19._8_4_ = auVar18._8_4_ << 0x1f, auVar19._12_4_ = auVar18._12_4_ << 0x1f,
     uVar10 = movmskps(iVar9,auVar19), (char)uVar10 != '\0')) {
    return 2;
  }
  uVar12 = stream->pos + 8;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    local_3c = 0x55;
    if (stream->size < uVar12) goto LAB_0021760f;
  }
  else {
    uVar11 = (*stream->read)(stream,uVar12,(uchar *)0x0,0);
    local_3c = 0x55;
    if (uVar11 != 0) goto LAB_0021760f;
  }
  stream->pos = uVar12;
  local_3c = 0;
LAB_0021760f:
  FVar7 = FT_Stream_ReadUShort(stream,&local_3c);
  if (local_3c != 0) {
    return local_3c;
  }
  if (-1 < (short)FVar7) {
    uVar17 = uVar17 + (long)(short)FVar7;
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      if (stream->size < uVar17) {
        return 0x55;
      }
    }
    else {
      uVar11 = (*stream->read)(stream,uVar17,(uchar *)0x0,0);
      if (uVar11 != 0) {
        return 0x55;
      }
    }
    stream->pos = uVar17;
    *map_offset = uVar17;
    return 0;
  }
  return 2;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Raccess_Get_HeaderInfo( FT_Library  library,
                             FT_Stream   stream,
                             FT_Long     rfork_offset,
                             FT_Long    *map_offset,
                             FT_Long    *rdata_pos )
  {
    FT_Error       error;
    unsigned char  head[16], head2[16];
    FT_Long        map_pos, map_len, rdata_len;
    int            allzeros, allmatch, i;
    FT_Long        type_list;

    FT_UNUSED( library );


    error = FT_Stream_Seek( stream, (FT_ULong)rfork_offset );
    if ( error )
      return error;

    error = FT_Stream_Read( stream, (FT_Byte*)head, 16 );
    if ( error )
      return error;

    /* ensure positive values */
    if ( head[0]  >= 0x80 ||
         head[4]  >= 0x80 ||
         head[8]  >= 0x80 ||
         head[12] >= 0x80 )
      return FT_THROW( Unknown_File_Format );

    *rdata_pos = ( head[ 0] << 24 ) |
                 ( head[ 1] << 16 ) |
                 ( head[ 2] <<  8 ) |
                   head[ 3];
    map_pos    = ( head[ 4] << 24 ) |
                 ( head[ 5] << 16 ) |
                 ( head[ 6] <<  8 ) |
                   head[ 7];
    rdata_len  = ( head[ 8] << 24 ) |
                 ( head[ 9] << 16 ) |
                 ( head[10] <<  8 ) |
                   head[11];
    map_len    = ( head[12] << 24 ) |
                 ( head[13] << 16 ) |
                 ( head[14] <<  8 ) |
                   head[15];

    /* the map must not be empty */
    if ( !map_pos )
      return FT_THROW( Unknown_File_Format );

    /* check whether rdata and map overlap */
    if ( *rdata_pos < map_pos )
    {
      if ( *rdata_pos > map_pos - rdata_len )
        return FT_THROW( Unknown_File_Format );
    }
    else
    {
      if ( map_pos > *rdata_pos - map_len )
        return FT_THROW( Unknown_File_Format );
    }

    /* check whether end of rdata or map exceeds stream size */
    if ( FT_LONG_MAX - rdata_len < *rdata_pos                               ||
         FT_LONG_MAX - map_len < map_pos                                    ||

         FT_LONG_MAX - ( *rdata_pos + rdata_len ) < rfork_offset            ||
         FT_LONG_MAX - ( map_pos + map_len ) < rfork_offset                 ||

         (FT_ULong)( rfork_offset + *rdata_pos + rdata_len ) > stream->size ||
         (FT_ULong)( rfork_offset + map_pos + map_len ) > stream->size      )
      return FT_THROW( Unknown_File_Format );

    *rdata_pos += rfork_offset;
    map_pos    += rfork_offset;

    error = FT_Stream_Seek( stream, (FT_ULong)map_pos );
    if ( error )
      return error;

    head2[15] = (FT_Byte)( head[15] + 1 );       /* make it be different */

    error = FT_Stream_Read( stream, (FT_Byte*)head2, 16 );
    if ( error )
      return error;

    allzeros = 1;
    allmatch = 1;
    for ( i = 0; i < 16; i++ )
    {
      if ( head2[i] != 0 )
        allzeros = 0;
      if ( head2[i] != head[i] )
        allmatch = 0;
    }
    if ( !allzeros && !allmatch )
      return FT_THROW( Unknown_File_Format );

    /* If we have reached this point then it is probably a mac resource */
    /* file.  Now, does it contain any interesting resources?           */

    (void)FT_STREAM_SKIP( 4        /* skip handle to next resource map */
                          + 2      /* skip file resource number */
                          + 2 );   /* skip attributes */

    if ( FT_READ_SHORT( type_list ) )
      return error;
    if ( type_list < 0 )
      return FT_THROW( Unknown_File_Format );

    error = FT_Stream_Seek( stream, (FT_ULong)( map_pos + type_list ) );
    if ( error )
      return error;

    *map_offset = map_pos + type_list;
    return FT_Err_Ok;
  }